

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void __thiscall
vsencoding::VSEncodingBlocks::encodeArray
          (VSEncodingBlocks *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  ulong uVar4;
  uint32_t *out_00;
  uint len_00;
  uint32_t csize;
  undefined8 uStack_38;
  
  len_00 = (uint)len;
  *out = len_00;
  *nvalue = 0;
  out_00 = out + 1;
  uVar4 = (ulong)this->VSENCODING_BLOCKSZ;
  uStack_38 = in_RAX;
  uVar2 = (uint)((ulong)in_RAX >> 0x20);
  if (this->VSENCODING_BLOCKSZ < len_00) {
    do {
      encodeVS(this,(uint32_t)uVar4,in,(uint32_t *)((long)&uStack_38 + 4),
               (this->__tmp).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start);
      uVar2 = uStack_38._4_4_;
      uVar3 = (ulong)uStack_38._4_4_;
      *out_00 = uStack_38._4_4_;
      memcpy(out_00 + 1,
             (this->__tmp).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,uVar3 * 4);
      uVar1 = this->VSENCODING_BLOCKSZ;
      uVar4 = (ulong)uVar1;
      out_00 = out_00 + uVar3 + 1;
      *nvalue = *nvalue + (ulong)(uVar2 + 1);
      in = in + uVar4;
      len_00 = (int)len - uVar1;
      len = (size_t)len_00;
      uVar2 = uStack_38._4_4_;
    } while (uVar1 < len_00);
  }
  uStack_38._4_4_ = uVar2;
  encodeVS(this,len_00,in,(uint32_t *)((long)&uStack_38 + 4),out_00);
  *nvalue = (ulong)uStack_38._4_4_ + 1 + *nvalue;
  return;
}

Assistant:

inline void VSEncodingBlocks::encodeArray(const uint32_t *in, const size_t len,
                                   uint32_t *out, size_t &nvalue) {
#ifndef NDEBUG
  const uint32_t *const initout(out);
#endif
  *(out++) = static_cast<uint32_t>(len);

  uint32_t res;
  const uint32_t *lin;
  uint32_t *lout;
  uint32_t csize;

  for (nvalue = 0, res = static_cast<uint32_t>(len), lin = in, lout = out;
       res > VSENCODING_BLOCKSZ; res -= VSENCODING_BLOCKSZ,
      lin += VSENCODING_BLOCKSZ, lout += csize, nvalue += csize + 1) {
    encodeVS(VSENCODING_BLOCKSZ, lin, csize, &__tmp[0]);
    *lout++ = csize;
    memcpy(lout, &__tmp[0], csize * sizeof(uint32_t));
  }

  encodeVS(res, lin, csize, lout);
  lout += csize;
  nvalue += csize;
  ++nvalue;
  ASSERT(nvalue + initout == lout,
    std::to_string(lout - initout) + " " + std::to_string(nvalue) + " " + std::to_string(csize));
}